

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O0

NameSyntax *
slang::ast::anon_unknown_39::splitScopedName
          (ScopedNameSyntax *syntax,
          SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *nameParts,int *colonParts
          )

{
  NameSyntax *pNVar1;
  SyntaxNode *this;
  int *in_RDX;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *in_RSI;
  ScopedNameSyntax *in_RDI;
  NameSyntax *in_stack_00000008;
  NameComponents *in_stack_00000010;
  ScopedNameSyntax *scoped;
  NamePlusLoc *item;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *this_00;
  NamePlusLoc local_68;
  ScopedNameSyntax *local_20;
  int *local_18;
  SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc> *local_10;
  
  local_20 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while( true ) {
    item = &local_68;
    this_00 = local_10;
    not_null<slang::syntax::NameSyntax_*>::operator*
              ((not_null<slang::syntax::NameSyntax_*> *)0x48061e);
    NameComponents::NameComponents(in_stack_00000010,in_stack_00000008);
    local_68.dotLocation = parsing::Token::location(&local_20->separator);
    pNVar1 = not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x48064b);
    local_68.kind = (pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind;
    SmallVectorBase<slang::ast::(anonymous_namespace)::NamePlusLoc>::push_back(this_00,item);
    if ((local_20->separator).kind == Dot) {
      *local_18 = 0;
    }
    else {
      *local_18 = *local_18 + 1;
    }
    pNVar1 = not_null<slang::syntax::NameSyntax_*>::operator->
                       ((not_null<slang::syntax::NameSyntax_*> *)0x480693);
    if ((pNVar1->super_ExpressionSyntax).super_SyntaxNode.kind != ScopedName) break;
    this = (SyntaxNode *)
           not_null<slang::syntax::NameSyntax_*>::operator->
                     ((not_null<slang::syntax::NameSyntax_*> *)0x4806ab);
    local_20 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(this);
  }
  pNVar1 = not_null::operator_cast_to_NameSyntax_((not_null<slang::syntax::NameSyntax_*> *)0x4806cb)
  ;
  return pNVar1;
}

Assistant:

const NameSyntax* splitScopedName(const ScopedNameSyntax& syntax,
                                  SmallVectorBase<NamePlusLoc>& nameParts, int& colonParts) {
    // Split the name into easier to manage chunks. The parser will always produce a
    // left-recursive name tree, so that's all we'll bother to handle.
    const ScopedNameSyntax* scoped = &syntax;
    while (true) {
        nameParts.push_back({*scoped->right, scoped->separator.location(), scoped->right->kind});
        if (scoped->separator.kind == TokenKind::Dot)
            colonParts = 0;
        else
            colonParts++;

        if (scoped->left->kind != SyntaxKind::ScopedName)
            break;

        scoped = &scoped->left->as<ScopedNameSyntax>();
    }
    return scoped->left;
}